

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::WeightParams::ByteSizeLong(WeightParams *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  string *psVar6;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t sStack_18;
  uint count;
  size_t total_size;
  WeightParams *this_local;
  
  sStack_18 = 0;
  uVar2 = floatvalue_size(this);
  sVar4 = (ulong)uVar2 * 4;
  if ((ulong)uVar2 != 0) {
    sStack_18 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar4);
    sStack_18 = sStack_18 + 1;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sVar4);
  this->_floatvalue_cached_byte_size_ = iVar3;
  sStack_18 = sVar4 + sStack_18;
  float16value_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = float16value_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::BytesSize(psVar6);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  rawvalue_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = rawvalue_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::BytesSize(psVar6);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  int8rawvalue_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = int8rawvalue_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::BytesSize(psVar6);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  bVar1 = has_quantization(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::QuantizationParams>(this->quantization_);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  bVar1 = isupdatable(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 3;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t WeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.WeightParams)
  size_t total_size = 0;

  // repeated float floatValue = 1;
  {
    unsigned int count = this->floatvalue_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _floatvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // bytes float16Value = 2;
  if (this->float16value().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->float16value());
  }

  // bytes rawValue = 30;
  if (this->rawvalue().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->rawvalue());
  }

  // bytes int8RawValue = 31;
  if (this->int8rawvalue().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->int8rawvalue());
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->has_quantization()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->quantization_);
  }

  // bool isUpdatable = 50;
  if (this->isupdatable() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}